

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O2

void x25519_ge_scalarmult(ge_p2 *r,uint8_t *scalar,ge_p3 *A)

{
  byte bVar1;
  ulong uVar2;
  ulong b;
  ge_cached *pgVar3;
  long lVar4;
  ge_p2 *r_00;
  ge_p2 *p;
  ge_cached selected;
  ge_p1p1 t;
  ge_p3 u;
  ge_p2 Ai_p2 [8];
  ge_cached Ai [16];
  
  Ai[0].YplusX.v[1] = 0;
  Ai[0].YplusX.v[2] = 0;
  Ai[0].YplusX.v[3] = 0;
  Ai[0].YplusX.v[4] = 0;
  Ai[0].YplusX.v[0] = 1;
  Ai[0].YminusX.v[1] = 0;
  Ai[0].YminusX.v[2] = 0;
  Ai[0].YminusX.v[3] = 0;
  Ai[0].YminusX.v[4] = 0;
  Ai[0].YminusX.v[0] = 1;
  Ai[0].Z.v[1] = 0;
  Ai[0].Z.v[2] = 0;
  Ai[0].Z.v[3] = 0;
  Ai[0].Z.v[4] = 0;
  Ai[0].Z.v[0] = 1;
  Ai[0].T2d.v[0] = 0;
  Ai[0].T2d.v[1] = 0;
  Ai[0].T2d.v[2] = 0;
  Ai[0].T2d.v[3] = 0;
  Ai[0].T2d.v[4] = 0;
  x25519_ge_p3_to_cached(Ai + 1,A);
  p = Ai_p2;
  Ai_p2[1].X.v[4] = (A->X).v[4];
  Ai_p2[1].X.v[0] = (A->X).v[0];
  Ai_p2[1].X.v[1] = (A->X).v[1];
  Ai_p2[1].X.v[2] = (A->X).v[2];
  Ai_p2[1].X.v[3] = (A->X).v[3];
  Ai_p2[1].Y.v[0] = (A->Y).v[0];
  Ai_p2[1].Y.v[1] = (A->Y).v[1];
  Ai_p2[1].Y.v[2] = (A->Y).v[2];
  Ai_p2[1].Y.v[3] = (A->Y).v[3];
  Ai_p2[1].Y.v[4] = (A->Y).v[4];
  Ai_p2[1].Z.v[0] = (A->Z).v[0];
  Ai_p2[1].Z.v[1] = (A->Z).v[1];
  Ai_p2[1].Z.v[2] = (A->Z).v[2];
  Ai_p2[1].Z.v[3] = (A->Z).v[3];
  Ai_p2[1].Z.v[4] = (A->Z).v[4];
  pgVar3 = Ai + 3;
  r_00 = Ai_p2 + 3;
  for (uVar2 = 2; p = p + 1, uVar2 < 0x10; uVar2 = uVar2 + 2) {
    ge_p2_dbl(&t,p);
    ge_p1p1_to_cached(pgVar3 + -1,&t);
    if (uVar2 < 8) {
      x25519_ge_p1p1_to_p2(r_00 + -1,&t);
    }
    x25519_ge_add(&t,A,pgVar3 + -1);
    ge_p1p1_to_cached(pgVar3,&t);
    if (uVar2 < 7) {
      x25519_ge_p1p1_to_p2(r_00,&t);
    }
    pgVar3 = pgVar3 + 2;
    r_00 = r_00 + 2;
  }
  (r->X).v[2] = 0;
  (r->X).v[3] = 0;
  (r->X).v[4] = 0;
  (r->X).v[0] = 0;
  (r->X).v[1] = 0;
  (r->Y).v[1] = 0;
  (r->Y).v[2] = 0;
  (r->Y).v[3] = 0;
  (r->Y).v[4] = 0;
  (r->Y).v[0] = 1;
  (r->Z).v[1] = 0;
  (r->Z).v[2] = 0;
  (r->Z).v[3] = 0;
  (r->Z).v[4] = 0;
  (r->Z).v[0] = 1;
  for (uVar2 = 0; (uint)uVar2 < 0x100; uVar2 = (ulong)((uint)uVar2 + 4)) {
    ge_p2_dbl(&t,r);
    x25519_ge_p1p1_to_p2(r,&t);
    ge_p2_dbl(&t,r);
    x25519_ge_p1p1_to_p2(r,&t);
    ge_p2_dbl(&t,r);
    x25519_ge_p1p1_to_p2(r,&t);
    ge_p2_dbl(&t,r);
    x25519_ge_p1p1_to_p3(&u,&t);
    bVar1 = scalar[0x1f - (uVar2 >> 3)];
    selected.YplusX.v[3] = 0;
    selected.YplusX.v[4] = 0;
    selected.YplusX.v[1] = 0;
    selected.YplusX.v[2] = 0;
    selected.YplusX.v[0] = 1;
    selected.YminusX.v[3] = 0;
    selected.YminusX.v[4] = 0;
    selected.YminusX.v[1] = 0;
    selected.YminusX.v[2] = 0;
    selected.YminusX.v[0] = 1;
    selected.Z.v[3] = 0;
    selected.Z.v[4] = 0;
    selected.Z.v[1] = 0;
    selected.Z.v[2] = 0;
    selected.Z.v[0] = 1;
    selected.T2d.v[4] = 0;
    selected.T2d.v[2] = 0;
    selected.T2d.v[3] = 0;
    selected.T2d.v[0] = 0;
    selected.T2d.v[1] = 0;
    pgVar3 = Ai;
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      b = (ulong)(bVar1 >> (~(byte)uVar2 & 4) & 0xf ^ (uint)lVar4) - 1 >> 0x3f;
      fe_cmov(&selected.YplusX,&pgVar3->YplusX,b);
      fe_cmov(&selected.YminusX,&pgVar3->YminusX,b);
      fe_cmov(&selected.Z,&pgVar3->Z,b);
      fe_cmov(&selected.T2d,&pgVar3->T2d,b);
      pgVar3 = pgVar3 + 1;
    }
    x25519_ge_add(&t,&u,&selected);
    x25519_ge_p1p1_to_p2(r,&t);
  }
  return;
}

Assistant:

void x25519_ge_scalarmult(ge_p2 *r, const uint8_t *scalar, const ge_p3 *A) {
  ge_p2 Ai_p2[8];
  ge_cached Ai[16];
  ge_p1p1 t;

  ge_cached_0(&Ai[0]);
  x25519_ge_p3_to_cached(&Ai[1], A);
  ge_p3_to_p2(&Ai_p2[1], A);

  unsigned i;
  for (i = 2; i < 16; i += 2) {
    ge_p2_dbl(&t, &Ai_p2[i / 2]);
    ge_p1p1_to_cached(&Ai[i], &t);
    if (i < 8) {
      x25519_ge_p1p1_to_p2(&Ai_p2[i], &t);
    }
    x25519_ge_add(&t, A, &Ai[i]);
    ge_p1p1_to_cached(&Ai[i + 1], &t);
    if (i < 7) {
      x25519_ge_p1p1_to_p2(&Ai_p2[i + 1], &t);
    }
  }

  ge_p2_0(r);
  ge_p3 u;

  for (i = 0; i < 256; i += 4) {
    ge_p2_dbl(&t, r);
    x25519_ge_p1p1_to_p2(r, &t);
    ge_p2_dbl(&t, r);
    x25519_ge_p1p1_to_p2(r, &t);
    ge_p2_dbl(&t, r);
    x25519_ge_p1p1_to_p2(r, &t);
    ge_p2_dbl(&t, r);
    x25519_ge_p1p1_to_p3(&u, &t);

    uint8_t index = scalar[31 - i / 8];
    index >>= 4 - (i & 4);
    index &= 0xf;

    unsigned j;
    ge_cached selected;
    ge_cached_0(&selected);
    for (j = 0; j < 16; j++) {
      cmov_cached(&selected, &Ai[j], 1 & constant_time_eq_w(index, j));
    }

    x25519_ge_add(&t, &u, &selected);
    x25519_ge_p1p1_to_p2(r, &t);
  }
}